

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O0

void __thiscall
helics::FilterFederate::processFilterInfo(FilterFederate *this,ActionMessage *command)

{
  string_view key;
  string_view key_00;
  bool bVar1;
  GlobalBrokerId GVar2;
  reference ppFVar3;
  FilterInfo *pFVar4;
  BasicHandleInfo *M;
  ActionMessage *in_RSI;
  string_view type_in;
  __sv_type _Var5;
  BasicHandleInfo *endhandle_1;
  FilterInfo *newFilter_1;
  FilterInfo **filt_1;
  iterator __end2;
  iterator __begin2;
  vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *__range2;
  FilterInfo *newFilter;
  ActionMessage err;
  BasicHandleInfo *endhandle;
  FilterInfo **filt;
  iterator __end3;
  iterator __begin3;
  vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *__range3;
  bool FilterAlreadyPresent;
  FilterCoordinator *filterC;
  FilterFederate *in_stack_fffffffffffffcb8;
  GlobalHandle in_stack_fffffffffffffcc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  FilterFederate *in_stack_fffffffffffffcc8;
  HandleManager *in_stack_fffffffffffffcd0;
  InterfaceHandle in_stack_fffffffffffffcdc;
  ActionMessage *in_stack_fffffffffffffce0;
  undefined7 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcef;
  allocator<char> *in_stack_fffffffffffffcf0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *in_stack_fffffffffffffd08;
  FilterFederate *in_stack_fffffffffffffd10;
  InterfaceHandle in_stack_fffffffffffffd1c;
  undefined8 in_stack_fffffffffffffd60;
  undefined1 uVar7;
  FilterFederate *in_stack_fffffffffffffd68;
  size_t in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  char *pcVar8;
  InterfaceHandle in_stack_fffffffffffffd80;
  InterfaceHandle handle;
  GlobalBrokerId in_stack_fffffffffffffd84;
  allocator<char> local_271;
  string_view in_stack_fffffffffffffd90;
  string_view in_stack_fffffffffffffda0;
  __normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
  local_200;
  vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *local_1f8;
  __sv_type local_1f0;
  __sv_type local_1e0;
  allocator<char> local_1c9;
  string_view local_1c8;
  __sv_type local_198;
  BaseType local_188;
  BaseType local_184;
  GlobalHandle local_180;
  FilterInfo *local_178;
  GlobalHandle local_120;
  ActionMessage local_118;
  BaseType local_5c;
  BasicHandleInfo *local_58;
  BaseType local_50;
  BaseType local_4c;
  BaseType local_48;
  BaseType local_44;
  reference local_40;
  FilterInfo **local_38;
  __normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
  local_30;
  vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *local_28;
  byte local_1d;
  BaseType local_1c;
  FilterCoordinator *local_18;
  ActionMessage *local_10;
  
  local_1c = (in_RSI->dest_handle).hid;
  local_10 = in_RSI;
  local_18 = getFilterCoordinator(in_stack_fffffffffffffd10,in_stack_fffffffffffffd1c);
  if (local_18 != (FilterCoordinator *)0x0) {
    local_1d = 0;
    bVar1 = checkActionFlag<helics::ActionMessage,helics::InterfaceFlags>
                      (local_10,destination_target);
    if (bVar1) {
      bVar1 = checkActionFlag<helics::ActionMessage,helics::FilterFlags>(local_10,clone_flag);
      uVar7 = (undefined1)((ulong)in_stack_fffffffffffffd60 >> 0x38);
      if (bVar1) {
        local_28 = &local_18->cloningDestFilters;
        local_30._M_current =
             (FilterInfo **)
             std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::begin
                       ((vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *)
                        in_stack_fffffffffffffcb8);
        local_38 = (FilterInfo **)
                   std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::end
                             ((vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *
                              )in_stack_fffffffffffffcb8);
        while( true ) {
          bVar1 = __gnu_cxx::
                  operator==<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                            ((__normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                              *)in_stack_fffffffffffffcc0,
                             (__normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                              *)in_stack_fffffffffffffcb8);
          uVar7 = (undefined1)((ulong)in_stack_fffffffffffffd60 >> 0x38);
          if (((bVar1 ^ 0xffU) & 1) == 0) break;
          local_40 = __gnu_cxx::
                     __normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                     ::operator*(&local_30);
          pFVar4 = *local_40;
          local_44 = (BaseType)
                     GlobalFederateId::operator_cast_to_GlobalBrokerId
                               (&in_stack_fffffffffffffcb8->mFedID);
          bVar1 = GlobalBrokerId::operator==(&pFVar4->core_id,(GlobalBrokerId)local_44);
          if (bVar1) {
            local_48 = (local_10->source_handle).hid;
            bVar1 = InterfaceHandle::operator==(&(*local_40)->handle,(InterfaceHandle)local_48);
            uVar7 = (undefined1)((ulong)in_stack_fffffffffffffd60 >> 0x38);
            if (bVar1) {
              local_1d = 1;
              break;
            }
          }
          __gnu_cxx::
          __normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
          ::operator++(&local_30);
        }
      }
      else if (local_18->destFilter != (FilterInfo *)0x0) {
        pFVar4 = local_18->destFilter;
        local_4c = (BaseType)
                   GlobalFederateId::operator_cast_to_GlobalBrokerId
                             (&in_stack_fffffffffffffcb8->mFedID);
        bVar1 = GlobalBrokerId::operator==(&pFVar4->core_id,(GlobalBrokerId)local_4c);
        if (bVar1) {
          local_50 = (local_10->source_handle).hid;
          bVar1 = InterfaceHandle::operator==
                            (&local_18->destFilter->handle,(InterfaceHandle)local_50);
          if (bVar1) {
            local_1d = 1;
          }
        }
      }
      if ((local_1d & 1) == 0) {
        local_5c = (local_10->dest_handle).hid;
        local_58 = HandleManager::getInterfaceHandle
                             (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcdc,
                              (InterfaceType)((ulong)in_stack_fffffffffffffcc8 >> 0x38));
        if (local_58 != (BasicHandleInfo *)0x0) {
          setActionFlag<helics::BasicHandleInfo,helics::FilterFlags>(local_58,has_dest_filter_flag);
          bVar1 = checkActionFlag<helics::ActionMessage,helics::FilterFlags>(local_10,clone_flag);
          if ((!bVar1) && ((local_18->hasDestFilters & 1U) != 0)) {
            ActionMessage::ActionMessage(in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc.hid);
            local_118.dest_id.gid = (local_10->source_id).gid;
            local_120 = ActionMessage::getDest((ActionMessage *)in_stack_fffffffffffffcb8);
            ActionMessage::setSource(&local_118,local_120);
            local_118.messageID = -1;
            std::operator+(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffcc8,(char *)in_stack_fffffffffffffcc0);
            SmallBuffer::operator=
                      ((SmallBuffer *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffce0);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffcc0);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffcc0);
            std::function<void_(helics::ActionMessage_&&)>::operator()
                      ((function<void_(helics::ActionMessage_&&)> *)in_stack_fffffffffffffcc0,
                       (ActionMessage *)in_stack_fffffffffffffcb8);
            ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffcc0);
            return;
          }
        }
        local_180 = ActionMessage::getSource((ActionMessage *)in_stack_fffffffffffffcb8);
        local_178 = getFilterInfo(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcc0);
        if (local_178 == (FilterInfo *)0x0) {
          local_184 = (BaseType)
                      GlobalFederateId::operator_cast_to_GlobalBrokerId
                                (&in_stack_fffffffffffffcb8->mFedID);
          local_188 = (local_10->source_handle).hid;
          local_1c8 = SmallBuffer::to_string((SmallBuffer *)0x57d27f);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
          local_198 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffcc0);
          ActionMessage::getString_abi_cxx11_
                    ((ActionMessage *)in_stack_fffffffffffffcc8,
                     in_stack_fffffffffffffcc0.handle.hid.hid);
          local_1e0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffcc0);
          ActionMessage::getString_abi_cxx11_
                    ((ActionMessage *)in_stack_fffffffffffffcc8,
                     in_stack_fffffffffffffcc0.handle.hid.hid);
          local_1f0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffcc0);
          checkActionFlag<helics::ActionMessage,helics::FilterFlags>(local_10,clone_flag);
          key._M_str = in_stack_fffffffffffffd78;
          key._M_len = in_stack_fffffffffffffd70;
          pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1e0._M_str;
          in_stack_fffffffffffffcc8 = (FilterFederate *)local_1f0._M_len;
          in_stack_fffffffffffffcd0 = (HandleManager *)local_1f0._M_str;
          local_178 = createFilter(in_stack_fffffffffffffd68,in_stack_fffffffffffffd84,
                                   in_stack_fffffffffffffd80,key,in_stack_fffffffffffffd90,
                                   in_stack_fffffffffffffda0,(bool)uVar7);
          std::__cxx11::string::~string(pbVar6);
          std::allocator<char>::~allocator(&local_1c9);
        }
        local_18->hasDestFilters = true;
        bVar1 = checkActionFlag<helics::ActionMessage,helics::FilterFlags>(local_10,clone_flag);
        if (bVar1) {
          std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::push_back
                    ((vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *)
                     in_stack_fffffffffffffcd0,(value_type *)in_stack_fffffffffffffcc8);
        }
        else {
          if (local_58 != (BasicHandleInfo *)0x0) {
            setActionFlag<helics::BasicHandleInfo,helics::FilterFlags>
                      (local_58,has_non_cloning_dest_filter_flag);
          }
          local_18->destFilter = local_178;
        }
      }
    }
    else {
      local_1f8 = &local_18->allSourceFilters;
      local_200._M_current =
           (FilterInfo **)
           std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::begin
                     ((vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *)
                      in_stack_fffffffffffffcb8);
      std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::end
                ((vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *)
                 in_stack_fffffffffffffcb8);
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                          ((__normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                            *)in_stack_fffffffffffffcc0,
                           (__normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                            *)in_stack_fffffffffffffcb8);
        uVar7 = (undefined1)((ulong)in_stack_fffffffffffffd60 >> 0x38);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        ppFVar3 = __gnu_cxx::
                  __normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                  ::operator*(&local_200);
        pFVar4 = *ppFVar3;
        GVar2 = GlobalFederateId::operator_cast_to_GlobalBrokerId
                          (&in_stack_fffffffffffffcb8->mFedID);
        bVar1 = GlobalBrokerId::operator==(&pFVar4->core_id,GVar2);
        if (bVar1) {
          bVar1 = InterfaceHandle::operator==
                            (&(*ppFVar3)->handle,(InterfaceHandle)(local_10->source_handle).hid);
          uVar7 = (undefined1)((ulong)in_stack_fffffffffffffd60 >> 0x38);
          if (bVar1) {
            local_1d = 1;
            break;
          }
        }
        __gnu_cxx::
        __normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
        ::operator++(&local_200);
      }
      if ((local_1d & 1) == 0) {
        ActionMessage::getSource((ActionMessage *)in_stack_fffffffffffffcb8);
        pFVar4 = getFilterInfo(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcc0);
        if (pFVar4 == (FilterInfo *)0x0) {
          GlobalFederateId::operator_cast_to_GlobalBrokerId(&in_stack_fffffffffffffcb8->mFedID);
          type_in = SmallBuffer::to_string((SmallBuffer *)0x57d625);
          this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_271;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    (this_00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcc0);
          ActionMessage::getString_abi_cxx11_
                    ((ActionMessage *)in_stack_fffffffffffffcc8,
                     in_stack_fffffffffffffcc0.handle.hid.hid);
          _Var5 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffcc0);
          pcVar8 = (char *)_Var5._M_len;
          handle.hid = _Var5._M_str._0_4_;
          GVar2.gid = _Var5._M_str._4_4_;
          ActionMessage::getString_abi_cxx11_
                    ((ActionMessage *)in_stack_fffffffffffffcc8,
                     in_stack_fffffffffffffcc0.handle.hid.hid);
          _Var5 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffcc0);
          in_stack_fffffffffffffcc8 = (FilterFederate *)_Var5._M_len;
          in_stack_fffffffffffffcd0 = (HandleManager *)_Var5._M_str;
          checkActionFlag<helics::ActionMessage,helics::FilterFlags>(local_10,clone_flag);
          pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(GVar2.gid,handle.hid);
          key_00._M_str = pcVar8;
          key_00._M_len = (size_t)in_stack_fffffffffffffcd0;
          createFilter(in_stack_fffffffffffffcc8,GVar2,handle,key_00,(string_view)type_in,
                       in_stack_fffffffffffffda0,(bool)uVar7);
          std::__cxx11::string::~string(pbVar6);
          std::allocator<char>::~allocator(&local_271);
        }
        std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::push_back
                  ((vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *)
                   in_stack_fffffffffffffcd0,(value_type *)in_stack_fffffffffffffcc8);
        local_18->hasSourceFilters = true;
        M = HandleManager::getInterfaceHandle
                      (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcdc,
                       (InterfaceType)((ulong)in_stack_fffffffffffffcc8 >> 0x38));
        if (M != (BasicHandleInfo *)0x0) {
          setActionFlag<helics::BasicHandleInfo,helics::EndpointFlags>(M,has_source_filter_flag);
        }
      }
    }
  }
  return;
}

Assistant:

void FilterFederate::processFilterInfo(ActionMessage& command)
{
    auto* filterC = getFilterCoordinator(command.dest_handle);
    if (filterC == nullptr) {
        return;
    }
    bool FilterAlreadyPresent = false;
    if (checkActionFlag(command, destination_target)) {
        if (checkActionFlag(command, clone_flag)) {
            for (auto& filt : filterC->cloningDestFilters) {
                if ((filt->core_id == command.source_id) &&
                    (filt->handle == command.source_handle)) {
                    FilterAlreadyPresent = true;
                    break;
                }
            }
        } else {  // there can only be one non-cloning destination filter
            if (filterC->destFilter != nullptr) {
                if ((filterC->destFilter->core_id == command.source_id) &&
                    (filterC->destFilter->handle == command.source_handle)) {
                    FilterAlreadyPresent = true;
                }
            }
        }

        if (!FilterAlreadyPresent) {
            auto* endhandle =
                mHandles->getInterfaceHandle(command.dest_handle, InterfaceType::ENDPOINT);
            if (endhandle != nullptr) {
                setActionFlag(*endhandle, has_dest_filter_flag);
                if ((!checkActionFlag(command, clone_flag)) && (filterC->hasDestFilters)) {
                    // duplicate non cloning destination filters are not allowed
                    ActionMessage err(CMD_ERROR);
                    err.dest_id = command.source_id;
                    err.setSource(command.getDest());
                    err.messageID = defs::Errors::REGISTRATION_FAILURE;
                    err.payload =
                        "Endpoint " + endhandle->key + " already has a destination filter";
                    mSendMessageMove(std::move(err));
                    return;
                }
            }
            auto* newFilter = getFilterInfo(command.getSource());
            if (newFilter == nullptr) {
                newFilter = createFilter(GlobalBrokerId(command.source_id),
                                         command.source_handle,
                                         std::string(command.payload.to_string()),
                                         command.getString(typeStringLoc),
                                         command.getString(typeOutStringLoc),
                                         checkActionFlag(command, clone_flag));
            }

            filterC->hasDestFilters = true;
            if (checkActionFlag(command, clone_flag)) {
                filterC->cloningDestFilters.push_back(newFilter);
            } else {
                if (endhandle != nullptr) {
                    setActionFlag(*endhandle, has_non_cloning_dest_filter_flag);
                }
                filterC->destFilter = newFilter;
            }
        }
    } else {
        for (auto& filt : filterC->allSourceFilters) {
            if ((filt->core_id == command.source_id) && (filt->handle == command.source_handle)) {
                FilterAlreadyPresent = true;
                break;
            }
        }
        if (!FilterAlreadyPresent) {
            auto* newFilter = getFilterInfo(command.getSource());
            if (newFilter == nullptr) {
                newFilter = createFilter(GlobalBrokerId(command.source_id),
                                         command.source_handle,
                                         std::string(command.payload.to_string()),
                                         command.getString(typeStringLoc),
                                         command.getString(typeOutStringLoc),
                                         checkActionFlag(command, clone_flag));
            }
            filterC->allSourceFilters.push_back(newFilter);
            filterC->hasSourceFilters = true;
            auto* endhandle =
                mHandles->getInterfaceHandle(command.dest_handle, InterfaceType::ENDPOINT);
            if (endhandle != nullptr) {
                setActionFlag(*endhandle, has_source_filter_flag);
            }
        }
    }
}